

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iexchange.cpp
# Opt level: O0

bool bounce(Block *b,ProxyWithLink *cp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  BlockID *pBVar7;
  char *in_RDX;
  ProxyWithLink *in_RSI;
  _Base_ptr in_RDI;
  char (*unaff_retaddr) [25];
  FILE *in_stack_00000008;
  int nbr_1;
  Particle p_1;
  int nbr_gid;
  int i;
  Particle p;
  int nbr;
  int id;
  int my_gid;
  Link *l;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Proxy *in_stack_ffffffffffffff70;
  BlockID *in_stack_ffffffffffffff78;
  Proxy *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  FILE *f;
  
  iVar2 = diy::Master::ProxyWithLink::link(in_RSI,(char *)in_RSI,in_RDX);
  f = (FILE *)CONCAT44(extraout_var,iVar2);
  iVar3 = diy::Master::Proxy::gid(&in_RSI->super_Proxy);
  iVar2 = iVar3 * 1000;
  if (0 < (int)in_RDI->_M_color) {
    fmt::v7::print<char[27],int&,int&,char>
              ((FILE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (char (*) [27])CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  while (0 < (int)in_RDI->_M_color) {
    in_stack_ffffffffffffffdc = rand();
    iVar4 = diy::Link::size((Link *)0x112482);
    in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc % iVar4;
    iVar4 = iVar2 + 1;
    iVar5 = rand();
    Particle::Particle((Particle *)&stack0xffffffffffffffd4,iVar2,iVar5 % 0x14 + 1);
    diy::Link::target((Link *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    fmt::v7::print<char[25],int&,int&,int&,int&,char>
              (in_stack_00000008,unaff_retaddr,(int *)in_RDI,(int *)in_RSI,(int *)f,
               (int *)CONCAT44(iVar3,iVar4));
    diy::Link::target((Link *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    diy::Master::Proxy::enqueue<Particle>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (Particle *)in_stack_ffffffffffffff70,
               (_func_void_BinaryBuffer_ptr_Particle_ptr *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    in_RDI->_M_color = in_RDI->_M_color - _S_black;
    *(int *)&in_RDI->field_0x4 = *(int *)&in_RDI->field_0x4 + 1;
    *(int *)&in_RDI->_M_parent = in_stack_ffffffffffffffd8 + *(int *)&in_RDI->_M_parent;
    iVar2 = iVar4;
  }
  iVar4 = 0;
  while (iVar5 = iVar4, iVar6 = diy::Link::size((Link *)0x1125a2), iVar4 < iVar6) {
    pBVar7 = diy::Link::target((Link *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    iVar4 = pBVar7->gid;
    while( true ) {
      diy::Master::Proxy::incoming(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      bVar1 = diy::MemoryBuffer::operator_cast_to_bool((MemoryBuffer *)in_stack_ffffffffffffff70);
      if (!bVar1) break;
      Particle::Particle((Particle *)&stack0xffffffffffffffc4,-1,0);
      diy::Master::Proxy::dequeue<Particle>
                (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 (Particle *)in_stack_ffffffffffffff70,
                 (_func_void_BinaryBuffer_ptr_Particle_ptr *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      fmt::v7::print<char[25],int&,int&,int&,int&,char>
                (in_stack_00000008,unaff_retaddr,(int *)in_RDI,(int *)in_RSI,(int *)f,
                 (int *)CONCAT44(iVar3,iVar2));
      in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + -1;
      *(int *)&in_RDI->_M_left = *(int *)&in_RDI->_M_left + 1;
      if (in_stack_ffffffffffffffc8 < 1) {
        fmt::v7::print<char[30],int&,int&,int&,char>
                  (f,(char (*) [30])CONCAT44(iVar3,iVar2),
                   (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   (int *)CONCAT44(in_stack_ffffffffffffffd4,iVar5),
                   (int *)CONCAT44(iVar4,in_stack_ffffffffffffffc8));
        *(int *)((long)&in_RDI->_M_parent + 4) = *(int *)((long)&in_RDI->_M_parent + 4) + 1;
      }
      else {
        in_stack_ffffffffffffff6c = rand();
        diy::Link::size((Link *)0x112682);
        in_stack_ffffffffffffff78 = (BlockID *)&stack0xffffffffffffffc4;
        in_stack_ffffffffffffff80 = (Proxy *)&stack0xffffffffffffffc8;
        in_stack_ffffffffffffff70 = _stderr;
        diy::Link::target((Link *)_stderr,in_stack_ffffffffffffff6c);
        fmt::v7::print<char[25],int&,int&,int&,int&,char>
                  (in_stack_00000008,unaff_retaddr,(int *)in_RDI,(int *)in_RSI,(int *)f,
                   (int *)CONCAT44(iVar3,iVar2));
        diy::Link::target((Link *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        diy::Master::Proxy::enqueue<Particle>
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   (Particle *)in_stack_ffffffffffffff70,
                   (_func_void_BinaryBuffer_ptr_Particle_ptr *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
    }
    iVar4 = iVar5 + 1;
  }
  return true;
}

Assistant:

bool bounce(Block*                              b,
            const diy::Master::ProxyWithLink&  cp)
{
    diy::Link* l = cp.link();
    int my_gid   = cp.gid();

    // start with every block enqueueing particles to random neighbors
    int id = my_gid * 1000;
    if (b->count > 0)
        fmt::print(stderr, "[{}] enqueue {} particles\n", my_gid, b->count);
    while (b->count > 0)
    {
        int nbr = rand() % l->size();
        Particle p(id++, 1 + rand() % 20);
        fmt::print(stderr, "[{}] -> ({},{}) -> [{}]\n", my_gid, p.id, p.hops, l->target(nbr).gid);
        cp.enqueue(l->target(nbr), p);
        b->count--;

        b->expected_particles++;
        b->expected_hops += p.hops;
    }

    // then dequeue as long as something is incoming and enqueue as long as the hop count is not exceeded
    // bounce will be called by master multiple times until no more messages are in flight anywhere
    for (int i = 0; i < l->size(); ++i)
    {
        int nbr_gid = l->target(i).gid;
        while (cp.incoming(nbr_gid))
        {
            Particle p;
            cp.dequeue(nbr_gid, p);
            fmt::print(stderr, "[{}] <- ({},{}) <- [{}]\n", my_gid, p.id, p.hops, nbr_gid);

            p.hops--;
            b->finished_hops++;
            if (p.hops > 0)
            {
                int nbr = rand() % l->size();
                fmt::print(stderr, "[{}] -> ({},{}) -> [{}]\n", my_gid, p.id, p.hops, l->target(nbr).gid);
                cp.enqueue(l->target(nbr), p);
            } else
            {
                fmt::print(stderr, "[{}] finish particle ({},{})\n", my_gid, p.id, p.hops);
                b->finished_particles++;
            }
        }
    }

    return true;
}